

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

int google::protobuf::compiler::cpp::EstimateAlignmentSize(FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  LogMessage LStack_18;
  
  if (field == (FieldDescriptor *)0x0) {
    iVar2 = 0;
  }
  else {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      EstimateAlignmentSize();
LAB_001aea86:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_18);
    }
    iVar2 = 8;
    if ((bVar1 & 0x20) == 0) {
      if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) - 1U) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/helpers.cc"
                   ,0x2c1);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&LStack_18,(char (*) [16])"Can\'t get here.");
        goto LAB_001aea86;
      }
      iVar2 = *(int *)(&DAT_0051b6ec +
                      (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)
                             - 1U) * 4);
    }
  }
  return iVar2;
}

Assistant:

int EstimateAlignmentSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) return 8;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}